

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

void __thiscall cmGetPropertyCommand::cmGetPropertyCommand(cmGetPropertyCommand *this)

{
  cmGetPropertyCommand *this_local;
  
  cmCommand::cmCommand(&this->super_cmCommand);
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmGetPropertyCommand_00d9f950;
  std::__cxx11::string::string((string *)&this->Variable);
  std::__cxx11::string::string((string *)&this->Name);
  std::__cxx11::string::string((string *)&this->PropertyName);
  this->InfoType = OutValue;
  return;
}

Assistant:

cmGetPropertyCommand::cmGetPropertyCommand()
{
  this->InfoType = OutValue;
}